

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

pair<unsigned_long,_unsigned_long> farmhashcc::WeakHashLen32WithSeeds(char *s,uint64_t a,uint64_t b)

{
  uint64_t b_00;
  uint64_t a_00;
  uint64_t in_RDX;
  uint64_t in_RSI;
  char *in_RDI;
  pair<unsigned_long,_unsigned_long> pVar1;
  uint64_t in_stack_fffffffffffffff0;
  
  util::Fetch64(in_RDI);
  b_00 = util::Fetch64(in_RDI + 8);
  a_00 = util::Fetch64(in_RDI + 0x10);
  util::Fetch64(in_RDI + 0x18);
  pVar1 = WeakHashLen32WithSeeds(in_stack_fffffffffffffff0,(uint64_t)in_RDI,in_RSI,in_RDX,a_00,b_00)
  ;
  return pVar1;
}

Assistant:

STATIC_INLINE pair<uint64_t, uint64_t> WeakHashLen32WithSeeds(
    const char* s, uint64_t a, uint64_t b) {
  return WeakHashLen32WithSeeds(Fetch(s),
                                Fetch(s + 8),
                                Fetch(s + 16),
                                Fetch(s + 24),
                                a,
                                b);
}